

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadSection(CrateReader *this,Section *s)

{
  int64_t *ret;
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  ostringstream ss_e;
  
  sVar2 = StreamReader::read(this->_sr,0x10,(void *)0x10,(size_t)s);
  if (sVar2 == 0x10) {
    ret = &s->start;
    bVar1 = StreamReader::read8(this->_sr,ret);
    if (bVar1) {
      if (this->_sr->length_ < (ulong)*ret) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadSection");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1537);
        ::std::operator<<(poVar3," ");
        pcVar4 = "Section start offset exceeds USDC file size.";
      }
      else {
        bVar1 = StreamReader::read8(this->_sr,&s->size);
        if (!bVar1) goto LAB_0018bf57;
        if ((ulong)(s->size + *ret) <= this->_sr->length_) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadSection");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1540);
        ::std::operator<<(poVar3," ");
        pcVar4 = "Section end offset exceeds USDC file size.";
      }
      poVar3 = ::std::operator<<((ostream *)&ss_e,pcVar4);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      return false;
    }
  }
LAB_0018bf57:
  ::std::__cxx11::string::append((char *)&this->_err);
  return false;
}

Assistant:

bool CrateReader::ReadSection(crate::Section *s) {
  size_t name_len = crate::kSectionNameMaxLength + 1;

  if (name_len !=
      _sr->read(name_len, name_len, reinterpret_cast<uint8_t *>(s->name))) {
    _err += "Failed to read section.name.\n";
    return false;
  }

  if (!_sr->read8(&s->start)) {
    _err += "Failed to read section.start.\n";
    return false;
  }

  if (size_t(s->start) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section start offset exceeds USDC file size.");
  }

  if (!_sr->read8(&s->size)) {
    _err += "Failed to read section.size.\n";
    return false;
  }

  if (size_t(s->start + s->size) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section end offset exceeds USDC file size.");
  }


  return true;
}